

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O3

void __thiscall
NumberTemp::ProcessIndirUse
          (NumberTemp *this,IndirOpnd *indirOpnd,Instr *instr,BackwardPass *backwardPass)

{
  ushort uVar1;
  uint dstSymID;
  Opnd *this_00;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  
  bVar3 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x356,"(backwardPass->DoMarkTempNumbersOnTempObjects())",
                       "backwardPass->DoMarkTempNumbersOnTempObjects()");
    if (!bVar3) goto LAB_00631a17;
    *puVar5 = 0;
  }
  bVar3 = IsTempIndirTransferLoad(this,instr,backwardPass);
  if (bVar3) {
    uVar1 = *(ushort *)&instr->field_0x36;
    if ((uVar1 & 2) == 0) {
      this->nonTempElemLoad = true;
    }
    else if (this->propertyIdsTempTransferDependencies !=
             (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
      this_00 = instr->m_dst;
      OVar4 = IR::Opnd::GetKind(this_00);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                           ,0x365,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
        if (!bVar3) goto LAB_00631a17;
        *puVar5 = 0;
      }
      OVar4 = IR::Opnd::GetKind(this_00);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) {
LAB_00631a17:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      dstSymID = *(uint *)(this_00[1]._vptr_Opnd + 2);
      TempTrackerBase::AddTransferDependencies
                (&this->super_TempTrackerBase,&this->elemLoadDependencies,dstSymID);
      bVar3 = DoTrace(backwardPass);
      if (bVar3) {
        pcVar7 = L"Prepass ";
        if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
          pcVar7 = L"";
        }
        Output::Print(L"%s: %8s s%d -> []: ",L"MarkTempNumber",pcVar7,(ulong)dstSymID);
        BVSparse<Memory::JitArenaAllocator>::Dump(&this->elemLoadDependencies);
      }
    }
    bVar3 = DoTrace(backwardPass);
    if (bVar3) {
      pcVar7 = L"Prepass ";
      if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
        pcVar7 = L"";
      }
      pcVar6 = L"Non ";
      if ((uVar1 & 2) != 0) {
        pcVar6 = L"";
      }
      Output::Print(L"%s: %8s%4sTemp Use ([] )",L"MarkTempNumber",pcVar7,pcVar6);
      IR::Instr::DumpSimple(instr);
      return;
    }
  }
  return;
}

Assistant:

void
NumberTemp::ProcessIndirUse(IR::IndirOpnd * indirOpnd, IR::Instr * instr, BackwardPass * backwardPass)
{
    Assert(backwardPass->DoMarkTempNumbersOnTempObjects());
    if (!NumberTemp::IsTempIndirTransferLoad(instr, backwardPass))
    {
        return;
    }

    bool isTempUse = instr->dstIsTempNumber;
    if (!isTempUse)
    {
        nonTempElemLoad = true;
    }
    else if (this->IsInLoop())
    {
        // We didn't already detect non temp use of this property id. so we should track the dependencies in loops
        IR::Opnd * dstOpnd = instr->GetDst();
        Assert(dstOpnd->IsRegOpnd());
        SymID dstSymID = dstOpnd->AsRegOpnd()->m_sym->m_id;

        // Use the no property id as a place holder for elem dependencies
        AddTransferDependencies(&elemLoadDependencies, dstSymID);
#if DBG_DUMP
        if (NumberTemp::DoTrace(backwardPass))
        {
            Output::Print(_u("%s: %8s s%d -> []: "), NumberTemp::GetTraceName(),
                backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), dstSymID);
            elemLoadDependencies.Dump();
        }
#endif
    }

#if DBG_DUMP
    if (NumberTemp::DoTrace(backwardPass))
    {
        Output::Print(_u("%s: %8s%4sTemp Use ([] )"), NumberTemp::GetTraceName(),
            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), isTempUse ? _u("") : _u("Non "));
        instr->DumpSimple();
    }
#endif
}